

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brush.cpp
# Opt level: O0

void anon_unknown.dwarf_1a3526::add_foreground(Brush *from,Brush *to)

{
  Brush *this;
  bool bVar1;
  ForegroundColor attribute;
  Color *pCVar2;
  bool local_33;
  Optional<cppurses::Color> local_32;
  byte local_2d;
  Optional<cppurses::Color> local_20;
  Optional<cppurses::Color> local_1c;
  Brush *local_18;
  Brush *to_local;
  Brush *from_local;
  
  local_18 = to;
  to_local = from;
  cppurses::Brush::foreground_color(&local_1c,to);
  bVar1 = opt::Optional<cppurses::Color>::operator!(&local_1c);
  local_2d = 0;
  local_33 = false;
  if (bVar1) {
    cppurses::Brush::foreground_color(&local_20,to_local);
    local_2d = 1;
    local_33 = opt::Optional::operator_cast_to_bool((Optional *)&local_20);
  }
  if ((local_2d & 1) != 0) {
    opt::Optional<cppurses::Color>::~Optional(&local_20);
  }
  opt::Optional<cppurses::Color>::~Optional(&local_1c);
  this = local_18;
  if (local_33 != false) {
    cppurses::Brush::foreground_color(&local_32,to_local);
    pCVar2 = opt::Optional<cppurses::Color>::operator*(&local_32);
    attribute = cppurses::foreground(*pCVar2);
    cppurses::Brush::add_attributes<cppurses::detail::ForegroundColor>(this,attribute);
    opt::Optional<cppurses::Color>::~Optional(&local_32);
  }
  return;
}

Assistant:

void add_foreground(const Brush& from, Brush& to) {
    if (!to.foreground_color() && from.foreground_color()) {
        to.add_attributes(foreground(*from.foreground_color()));
    }
}